

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> * __thiscall
dg::llvmdg::LazyLLVMCallGraph::getCallsOf
          (vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>
           *__return_storage_ptr__,LazyLLVMCallGraph *this,Function *F)

{
  bool bVar1;
  vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_> *__x;
  Use *use;
  CallInst *C;
  Function *local_48;
  value_type local_40;
  Function *local_38;
  
  local_38 = F;
  bVar1 = funHasAddressTaken(F);
  if (bVar1) {
    __x = getCallsOfAddressTaken(this,F);
    std::vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>::vector
              (__return_storage_ptr__,__x);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while (F = *(Function **)(F + 8), F != (Function *)0x0) {
      local_40 = *(value_type *)(F + 0x18);
      local_48 = *(Function **)(*(long *)(local_40 + 0x28) + 0x38);
      GenericCallGraph<const_llvm::Function_*>::addCall(&this->_cg,&local_48,&local_38);
      std::vector<const_llvm::CallInst_*,_std::allocator<const_llvm::CallInst_*>_>::push_back
                (__return_storage_ptr__,&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::CallInst *> getCallsOf(const llvm::Function *F) {
        if (funHasAddressTaken(F)) {
            return getCallsOfAddressTaken(F);
        }

        // has not address taken, so all users are calls
        std::vector<const llvm::CallInst *> ret;
        for (auto &use : F->uses()) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
            auto *user = *use;
#else
            auto *user = use.getUser();
#endif
            auto *C = llvm::cast<llvm::CallInst>(user);
            _cg.addCall(C->getParent()->getParent(), F);
            ret.push_back(C);
        }
        return ret;
    }